

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O0

int __thiscall uv::TCPClient::Send(TCPClient *this,char *data,size_t len)

{
  CStringStream *pCVar1;
  ILog4zManager *pIVar2;
  ssize_t sVar3;
  size_t in_RCX;
  long *in_FS_OFFSET;
  char *local_78;
  size_t iret;
  string local_60;
  undefined1 local_40 [8];
  CStringStream ss;
  size_t len_local;
  char *data_local;
  TCPClient *this_local;
  
  ss.m_pCur = (char *)len;
  if ((data == (char *)0x0) || (len == 0)) {
    std::__cxx11::string::operator=
              ((string *)&this->errmsg_,"send data is null or len less than zero.");
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_40,(char *)(*in_FS_OFFSET + -0x800),0x800);
    std::__cxx11::string::string((string *)&local_60,(string *)&this->errmsg_);
    zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40," ( ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar1,0x131);
    pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,3,*in_FS_OFFSET + -0x800);
    this_local._4_4_ = 0;
  }
  else {
    uv_async_send(&this->async_handle_);
    local_78 = (char *)0x0;
    while (((this->isuseraskforclosed_ ^ 0xffU) & 1) != 0) {
      uv_mutex_lock(&this->mutex_writebuf_);
      sVar3 = PodCircularBuffer<char>::write
                        (&this->write_circularbuf_,(int)data + (int)local_78,
                         (void *)(ulong)(uint)((int)ss.m_pCur - (int)local_78),in_RCX);
      local_78 = local_78 + (int)sVar3;
      uv_mutex_unlock(&this->mutex_writebuf_);
      if (ss.m_pCur <= local_78) break;
      usleep(100000);
    }
    uv_async_send(&this->async_handle_);
    this_local._4_4_ = (int)local_78;
  }
  return this_local._4_4_;
}

Assistant:

int TCPClient::Send(const char* data, std::size_t len)
{
    if (!data || len <= 0) {
        errmsg_ = "send data is null or len less than zero.";
        LOGE(errmsg_);
        return 0;
    }
    uv_async_send(&async_handle_);
    size_t iret = 0;
    while (!isuseraskforclosed_) {
        uv_mutex_lock(&mutex_writebuf_);
        iret += write_circularbuf_.write(data + iret, len - iret);
        uv_mutex_unlock(&mutex_writebuf_);
        if (iret < len) {
            ThreadSleep(100);
            continue;
        } else {
            break;
        }
    }
    uv_async_send(&async_handle_);
    return iret;
}